

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiIO::AddKeyAnalogEvent(ImGuiIO *this,ImGuiKey key,bool down,float analog_value)

{
  int *piVar1;
  ImGuiInputEvent *pIVar2;
  ImGuiContext *pIVar3;
  int iVar4;
  long lVar5;
  ImGuiKeyData *pIVar6;
  ulong uVar7;
  ImGuiInputEvent *__dest;
  int iVar8;
  anon_union_12_6_fccad779_for_ImGuiInputEvent_2 *paVar9;
  int iVar10;
  
  pIVar3 = GImGui;
  if (key == 0) {
    return;
  }
  if (this->AppAcceptingEvents != true) {
    return;
  }
  if (&GImGui->IO != this) {
    __assert_fail("&g.IO == this && \"Can only add events to current context.\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                  ,0x4ff,"void ImGuiIO::AddKeyAnalogEvent(ImGuiKey, bool, float)");
  }
  if (0x84 < key - 0x200U) {
    __assert_fail("ImGui::IsNamedKey(key)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                  ,0x500,"void ImGuiIO::AddKeyAnalogEvent(ImGuiKey, bool, float)");
  }
  if (this->BackendUsingLegacyKeyArrays != '\0') {
    if (this->BackendUsingLegacyKeyArrays != -1) {
      __assert_fail("(BackendUsingLegacyKeyArrays == -1 || BackendUsingLegacyKeyArrays == 0) && \"Backend needs to either only use io.AddKeyEvent(), either only fill legacy io.KeysDown[] + io.KeyMap[]. Not both!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                    ,0x504,"void ImGuiIO::AddKeyAnalogEvent(ImGuiKey, bool, float)");
    }
    lVar5 = 0;
    do {
      if (this->KeyMap[lVar5 + 0x200] != -1) {
        __assert_fail("KeyMap[n] == -1 && \"Backend needs to either only use io.AddKeyEvent(), either only fill legacy io.KeysDown[] + io.KeyMap[]. Not both!\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                      ,0x507,"void ImGuiIO::AddKeyAnalogEvent(ImGuiKey, bool, float)");
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x85);
  }
  this->BackendUsingLegacyKeyArrays = '\0';
  if (key - 0x269U < 0x18) {
    this->BackendUsingLegacyNavInputArray = false;
  }
  pIVar6 = ImGui::GetKeyData(key);
  if (pIVar6->Down == down) {
    if ((pIVar6->AnalogValue == analog_value) && (!NAN(pIVar6->AnalogValue) && !NAN(analog_value)))
    {
      uVar7 = (ulong)(pIVar3->InputEventsQueue).Size;
      if ((long)uVar7 < 1) {
        return;
      }
      paVar9 = &(pIVar3->InputEventsQueue).Data[uVar7 - 1].field_2;
      do {
        if (((ImGuiInputEvent *)((long)paVar9 + -8))->Type == ImGuiInputEventType_Key) {
          if ((uVar7 < 2) || ((paVar9->MouseButton).Button == key)) goto LAB_00125f11;
        }
        else if (uVar7 < 2) {
          return;
        }
        paVar9 = paVar9 + -2;
        uVar7 = uVar7 - 1;
      } while( true );
    }
  }
LAB_00125f1a:
  iVar4 = (pIVar3->InputEventsQueue).Size;
  if (iVar4 == (pIVar3->InputEventsQueue).Capacity) {
    if (iVar4 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar4 / 2 + iVar4;
    }
    iVar10 = iVar4 + 1;
    if (iVar4 + 1 < iVar8) {
      iVar10 = iVar8;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (ImGuiInputEvent *)(*GImAllocatorAllocFunc)((long)iVar10 * 0x18,GImAllocatorUserData);
    pIVar2 = (pIVar3->InputEventsQueue).Data;
    if (pIVar2 != (ImGuiInputEvent *)0x0) {
      memcpy(__dest,pIVar2,(long)(pIVar3->InputEventsQueue).Size * 0x18);
      pIVar2 = (pIVar3->InputEventsQueue).Data;
      if ((pIVar2 != (ImGuiInputEvent *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
    }
    (pIVar3->InputEventsQueue).Data = __dest;
    (pIVar3->InputEventsQueue).Capacity = iVar10;
    iVar4 = (pIVar3->InputEventsQueue).Size;
  }
  else {
    __dest = (pIVar3->InputEventsQueue).Data;
  }
  __dest[iVar4].Type = ImGuiInputEventType_Key;
  __dest[iVar4].Source = (key - 0x269U < 0x18) + ImGuiInputSource_Keyboard;
  __dest[iVar4].field_2.Key.Key = key;
  __dest[iVar4].field_2.MouseButton.Down = down;
  *(undefined2 *)((long)&__dest[iVar4].field_2 + 5) = 0;
  *(undefined1 *)((long)&__dest[iVar4].field_2 + 7) = 0;
  __dest[iVar4].field_2.Key.AnalogValue = analog_value;
  *(undefined4 *)&__dest[iVar4].AddedByTestEngine = 0;
  (pIVar3->InputEventsQueue).Size = (pIVar3->InputEventsQueue).Size + 1;
  return;
LAB_00125f11:
  if ((paVar9->MouseButton).Button != key) {
    return;
  }
  goto LAB_00125f1a;
}

Assistant:

void ImGuiIO::AddKeyAnalogEvent(ImGuiKey key, bool down, float analog_value)
{
    //if (e->Down) { IMGUI_DEBUG_LOG_IO("AddKeyEvent() Key='%s' %d, NativeKeycode = %d, NativeScancode = %d\n", ImGui::GetKeyName(e->Key), e->Down, e->NativeKeycode, e->NativeScancode); }
    if (key == ImGuiKey_None || !AppAcceptingEvents)
        return;
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");
    IM_ASSERT(ImGui::IsNamedKey(key)); // Backend needs to pass a valid ImGuiKey_ constant. 0..511 values are legacy native key codes which are not accepted by this API.

    // Verify that backend isn't mixing up using new io.AddKeyEvent() api and old io.KeysDown[] + io.KeyMap[] data.
#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
    IM_ASSERT((BackendUsingLegacyKeyArrays == -1 || BackendUsingLegacyKeyArrays == 0) && "Backend needs to either only use io.AddKeyEvent(), either only fill legacy io.KeysDown[] + io.KeyMap[]. Not both!");
    if (BackendUsingLegacyKeyArrays == -1)
        for (int n = ImGuiKey_NamedKey_BEGIN; n < ImGuiKey_NamedKey_END; n++)
            IM_ASSERT(KeyMap[n] == -1 && "Backend needs to either only use io.AddKeyEvent(), either only fill legacy io.KeysDown[] + io.KeyMap[]. Not both!");
    BackendUsingLegacyKeyArrays = 0;
#endif
    if (ImGui::IsGamepadKey(key))
        BackendUsingLegacyNavInputArray = false;

    // Partial filter of duplicates (not strictly needed, but makes data neater in particular for key mods and gamepad values which are most commonly spmamed)
    ImGuiKeyData* key_data = ImGui::GetKeyData(key);
    if (key_data->Down == down && key_data->AnalogValue == analog_value)
    {
        bool found = false;
        for (int n = g.InputEventsQueue.Size - 1; n >= 0 && !found; n--)
            if (g.InputEventsQueue[n].Type == ImGuiInputEventType_Key && g.InputEventsQueue[n].Key.Key == key)
                found = true;
        if (!found)
            return;
    }

    // Add event
    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_Key;
    e.Source = ImGui::IsGamepadKey(key) ? ImGuiInputSource_Gamepad : ImGuiInputSource_Keyboard;
    e.Key.Key = key;
    e.Key.Down = down;
    e.Key.AnalogValue = analog_value;
    g.InputEventsQueue.push_back(e);
}